

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O0

void __thiscall
TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePoint>_>::Read
          (TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePoint>_> *this,TPZStream *buf,void *context
          )

{
  int iVar1;
  TPZManVector<long,_128> *in_RDX;
  TPZStream *in_RSI;
  long *in_RDI;
  int classid;
  void *in_stack_00000210;
  TPZStream *in_stack_00000218;
  TPZIntelGen<pzshape::TPZShapePoint> *in_stack_00000220;
  size_t in_stack_000003f8;
  char *in_stack_00000400;
  int local_1c;
  
  TPZIntelGen<pzshape::TPZShapePoint>::Read(in_stack_00000220,in_stack_00000218,in_stack_00000210);
  TPZStream::Read<128>(in_RSI,in_RDX);
  (*in_RSI->_vptr_TPZStream[0x1d])(in_RSI,&local_1c,1);
  iVar1 = (**(code **)(*in_RDI + 0x20))();
  if (local_1c != iVar1) {
    pzinternal::DebugStopImpl(in_stack_00000400,in_stack_000003f8);
  }
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::Read(TPZStream &buf, void *context)
{
    TBASE::Read(buf,context);
    buf.Read( fIntPtIndices);
    int classid;
    buf.Read(&classid);
    if (classid != ClassId()) {
        DebugStop();
    }
}